

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int sam_bam_cram_readrec(BGZF *bgzfp,void *fpv,void *bv,int *tid,int *beg,int *end)

{
  int iVar1;
  bam1_t *b;
  
  b = (bam1_t *)bv;
  if (*(int *)((long)fpv + 0x44) == 6) {
    iVar1 = cram_get_bam_seq(*(cram_fd **)((long)fpv + 0x38),&b);
    return iVar1;
  }
  if (*(int *)((long)fpv + 0x44) == 4) {
    iVar1 = bam_read1(bgzfp,(bam1_t *)bv);
    return iVar1;
  }
  fwrite("[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n",0x40,1,_stderr);
  abort();
}

Assistant:

static int sam_bam_cram_readrec(BGZF *bgzfp, void *fpv, void *bv, int *tid, int *beg, int *end)
{
    htsFile *fp = fpv;
    bam1_t *b = bv;
    switch (fp->format.format) {
    case bam:   return bam_read1(bgzfp, b);
    case cram:  return cram_get_bam_seq(fp->fp.cram, &b);
    default:
        // TODO Need headers available to implement this for SAM files
        fprintf(stderr, "[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n");
        abort();
    }
}